

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::spacechar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  anon_unknown_10 *paVar1;
  bool bVar2;
  size_t sVar3;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  LexCtx local_40;
  
  local_40.lexedSize = 0;
  sv._M_str = " ";
  sv._M_len = 1;
  local_40.input._M_len = (size_t)this;
  local_40.input._M_str = (char *)in._M_len;
  sVar3 = LexCtx::startsWith(&local_40,sv);
  paVar1 = (anon_unknown_10 *)0x1;
  if ((sVar3 == 0) &&
     (((sv_00._M_str = "\n", sv_00._M_len = 1, sVar3 = LexCtx::startsWith(&local_40,sv_00),
       sVar3 != 0 ||
       (sv_01._M_str = "\r", sv_01._M_len = 1, sVar3 = LexCtx::startsWith(&local_40,sv_01),
       sVar3 != 0)) ||
      (sv_02._M_str = "\t", sv_02._M_len = 1, sVar3 = LexCtx::startsWith(&local_40,sv_02),
      paVar1 = (anon_unknown_10 *)local_40.lexedSize, sVar3 != 0)))) {
    paVar1 = (anon_unknown_10 *)(local_40.lexedSize + 1);
  }
  local_40.lexedSize = (size_t)paVar1;
  if ((anon_unknown_10 *)local_40.lexedSize == (anon_unknown_10 *)0x0) {
    bVar2 = false;
  }
  else {
    if (this < local_40.lexedSize) {
      local_40.lexedSize = (size_t)this;
    }
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
    _M_value.span._M_len = local_40.lexedSize;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_payload.
    _M_value.span._M_str = (char *)in._M_len;
    bVar2 = true;
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged = bVar2
  ;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> spacechar(std::string_view in) {
  LexCtx ctx(in);
  ctx.takePrefix(" "sv) || ctx.takePrefix("\n"sv) || ctx.takePrefix("\r"sv) ||
    ctx.takePrefix("\t"sv);
  return ctx.lexed();
}